

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O0

void __thiscall
Signal<std::shared_ptr<Transcript>_>::Emit
          (Signal<std::shared_ptr<Transcript>_> *this,shared_ptr<Transcript> *p)

{
  bool bVar1;
  reference ppVar2;
  shared_ptr<Transcript> local_68;
  undefined1 local_58 [8];
  pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_> it;
  iterator __end0;
  iterator __begin0;
  map<int,_std::function<void_(std::shared_ptr<Transcript>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_>_>_>
  *__range2;
  shared_ptr<Transcript> *p_local;
  Signal<std::shared_ptr<Transcript>_> *this_local;
  
  __end0 = std::
           map<int,_std::function<void_(std::shared_ptr<Transcript>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_>_>_>
           ::begin(&this->slots_);
  it.second._M_invoker =
       (_Invoker_type)
       std::
       map<int,_std::function<void_(std::shared_ptr<Transcript>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_>_>_>
       ::end(&this->slots_);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&it.second._M_invoker);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_>_>
             ::operator*(&__end0);
    std::pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_>::pair
              ((pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_> *)local_58,
               ppVar2);
    std::shared_ptr<Transcript>::shared_ptr(&local_68,p);
    std::function<void_(std::shared_ptr<Transcript>)>::operator()
              ((function<void_(std::shared_ptr<Transcript>)> *)&it,&local_68);
    std::shared_ptr<Transcript>::~shared_ptr(&local_68);
    std::pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_>::~pair
              ((pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_> *)local_58);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::function<void_(std::shared_ptr<Transcript>)>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

void Emit(Args... p) {
    for (auto it : slots_) {
      it.second(p...);
    }
  }